

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O3

void __thiscall
pbrt::SceneEntity::SceneEntity
          (SceneEntity *this,string *name,ParameterDictionary *parameters,FileLoc loc)

{
  pointer pcVar1;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_28;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  local_28.memoryResource = pstd::pmr::new_delete_resource();
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&(this->parameters).params,&parameters->params,&local_28);
  (this->parameters).colorSpace = parameters->colorSpace;
  (this->loc).filename._M_len = loc.filename._M_len;
  (this->loc).filename._M_str = loc.filename._M_str;
  (this->loc).line = loc.line;
  (this->loc).column = loc.column;
  return;
}

Assistant:

SceneEntity(const std::string &name, ParameterDictionary parameters, FileLoc loc)
        : name(name), parameters(parameters), loc(loc) {}